

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus applyScalingToLpCol(HighsLp *lp,HighsInt col,double colScale)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  HighsStatus HVar4;
  
  if ((((colScale != 0.0) || (HVar4 = kError, NAN(colScale))) && (HVar4 = kError, -1 < col)) &&
     (col < lp->num_col_)) {
    HighsSparseMatrix::scaleCol(&lp->a_matrix_,col,colScale);
    pdVar2 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[(uint)col] = pdVar2[(uint)col] * colScale;
    pdVar2 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar2[(uint)col];
    if (colScale <= 0.0) {
      pdVar3 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(uint)col] = pdVar3[(uint)col] / colScale;
      pdVar3[(uint)col] = dVar1 / colScale;
    }
    else {
      pdVar2[(uint)col] = dVar1 / colScale;
      pdVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(uint)col] = pdVar2[(uint)col] / colScale;
    }
    HVar4 = kOk;
  }
  return HVar4;
}

Assistant:

HighsStatus applyScalingToLpCol(HighsLp& lp, const HighsInt col,
                                const double colScale) {
  if (col < 0) return HighsStatus::kError;
  if (col >= lp.num_col_) return HighsStatus::kError;
  if (!colScale) return HighsStatus::kError;

  lp.a_matrix_.scaleCol(col, colScale);
  lp.col_cost_[col] *= colScale;
  if (colScale > 0) {
    lp.col_lower_[col] /= colScale;
    lp.col_upper_[col] /= colScale;
  } else {
    const double new_upper = lp.col_lower_[col] / colScale;
    lp.col_lower_[col] = lp.col_upper_[col] / colScale;
    lp.col_upper_[col] = new_upper;
  }
  return HighsStatus::kOk;
}